

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithm.h
# Opt level: O0

t2<unsigned_int,_idx2::channel_*> *
idx2::BinarySearch<idx2::t2<unsigned_int,idx2::channel*>,idx2::t2<unsigned_int,idx2::channel*>*>
          (t2<unsigned_int,_idx2::channel_*> *Beg,t2<unsigned_int,_idx2::channel_*> *End,
          t2<unsigned_int,_idx2::channel_*> *Val)

{
  undefined1 auVar1 [16];
  t2<unsigned_int,_idx2::channel_*> *ptVar2;
  t2<unsigned_int,_idx2::channel_*> *Mid;
  t2<unsigned_int,_idx2::channel_*> *Val_local;
  t2<unsigned_int,_idx2::channel_*> *End_local;
  t2<unsigned_int,_idx2::channel_*> *Beg_local;
  
  Val_local = End;
  End_local = Beg;
  do {
    while( true ) {
      if (Val_local <= End_local) {
        return Val_local;
      }
      auVar1._8_8_ = (long)Val_local - (long)End_local >> 0x3f;
      auVar1._0_8_ = (long)Val_local - (long)End_local >> 4;
      ptVar2 = End_local + SUB168(auVar1 / SEXT816(2),0);
      if (Val->First <= ptVar2->First) break;
      End_local = ptVar2 + 1;
    }
    Val_local = ptVar2;
  } while (Val->First < ptVar2->First);
  return ptVar2;
}

Assistant:

i
BinarySearch(i Beg, i End, const t& Val)
{
  while (Beg < End)
  {
    i Mid = Beg + (End - Beg) / 2;
    if (*Mid < Val)
    {
      Beg = Mid + 1;
      continue;
    }
    else if (Val < *Mid)
    {
      End = Mid;
      continue;
    }
    return Mid;
  }
  return End;
}